

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  BtShared **ppBVar1;
  char *pcVar2;
  char cVar3;
  PCache *pPVar4;
  sqlite3_file *psVar5;
  sqlite3_io_methods *psVar6;
  int iVar7;
  uint uVar8;
  Btree *p;
  BtShared *__s;
  size_t sVar9;
  size_t sVar10;
  char *pcVar11;
  Pager *pPVar12;
  ulong uVar13;
  sqlite3_mutex *psVar14;
  sqlite3_mutex *psVar15;
  void *pvVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  Btree **ppBVar21;
  code *pcVar22;
  Btree *pBVar23;
  long lVar24;
  Btree *pBVar25;
  int iVar26;
  u8 uVar27;
  uint uVar28;
  u64 n;
  Btree *pBVar29;
  Btree *pBVar30;
  ulong uVar31;
  byte bVar32;
  bool bVar33;
  bool bVar34;
  uchar zDbHeader [100];
  sqlite3_mutex *local_110;
  Pager *local_100;
  uint local_ec;
  char *local_e0;
  char *local_d8;
  u8 local_c0;
  uint local_a4;
  size_t local_a0;
  u32 local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  if (zFilename == (char *)0x0) {
LAB_0011ffcf:
    bVar33 = true;
    if (db->temp_store != '\x02') goto LAB_0011ffe6;
LAB_0011ffd9:
    local_ec = flags | 2;
    bVar17 = 1;
  }
  else {
    cVar3 = *zFilename;
    bVar33 = cVar3 == '\0';
    iVar7 = strcmp(zFilename,":memory:");
    if (iVar7 == 0) goto LAB_0011ffd9;
    if (cVar3 == '\0') goto LAB_0011ffcf;
    bVar33 = false;
LAB_0011ffe6:
    bVar17 = (byte)((vfsFlags & 0x80U) >> 7);
    local_ec = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar8 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar17 == 0 && !bVar33) {
    uVar8 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar8 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->pPrev = (Btree *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->nBackup = 0;
  p->iDataVersion = 0;
  p->pNext = (Btree *)0x0;
  p->pBt = (BtShared *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->hasIncrblobCur = '\0';
  p->wantToLock = 0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  if (bVar33) {
    local_110 = (sqlite3_mutex *)0x0;
  }
  else {
    if ((uVar8 >> 0x11 & 1) != 0 && ((uVar8 & 0x40) == 0 & bVar17) == 0) {
      if (zFilename == (char *)0x0) {
        uVar18 = 1;
      }
      else {
        sVar9 = strlen(zFilename);
        uVar18 = ((uint)sVar9 & 0x3fffffff) + 1;
      }
      uVar28 = pVfs->mxPathname + 1;
      uVar19 = uVar18;
      if ((int)uVar18 < (int)uVar28) {
        uVar19 = uVar28;
      }
      pcVar11 = (char *)sqlite3Malloc((ulong)uVar19);
      p->sharable = '\x01';
      if (pcVar11 == (char *)0x0) {
        sqlite3_free(p);
        return 7;
      }
      if (bVar17 == 0) {
        *pcVar11 = '\0';
        iVar7 = (*pVfs->xFullPathname)(pVfs,zFilename,uVar28,pcVar11);
        if (iVar7 != 0) {
          sqlite3_free(pcVar11);
          sqlite3_free(p);
          return iVar7;
        }
      }
      else {
        memcpy(pcVar11,zFilename,(ulong)uVar18);
      }
      bVar33 = true;
      if (sqlite3Config.bCoreMutex == 0) {
        psVar14 = (sqlite3_mutex *)0x0;
        bVar34 = true;
        local_110 = (sqlite3_mutex *)0x0;
      }
      else {
        local_110 = (*sqlite3Config.mutex.xMutexAlloc)(4);
        bVar34 = local_110 == (sqlite3_mutex *)0x0;
        if (!bVar34) {
          (*sqlite3Config.mutex.xMutexEnter)(local_110);
        }
        if ((sqlite3Config.bCoreMutex == 0) ||
           (psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar14 == (sqlite3_mutex *)0x0)) {
          psVar14 = (sqlite3_mutex *)0x0;
          bVar33 = true;
        }
        else {
          (*sqlite3Config.mutex.xMutexEnter)(psVar14);
          bVar33 = false;
        }
      }
      __s = sqlite3SharedCacheList;
      if (sqlite3SharedCacheList != (BtShared *)0x0) {
LAB_00120680:
        pPVar12 = __s->pPager;
        iVar7 = strcmp(pcVar11,pPVar12->zFilename);
        if ((iVar7 != 0) || (pPVar12->pVfs != pVfs)) goto LAB_001206a5;
        lVar24 = (long)db->nDb;
        if (0 < lVar24) {
          uVar13 = lVar24 + 1;
          ppBVar21 = &db->aDb[lVar24 + -1].pBt;
          do {
            if ((*ppBVar21 != (Btree *)0x0) && ((*ppBVar21)->pBt == __s)) {
              if (!bVar33) {
                (*sqlite3Config.mutex.xMutexLeave)(psVar14);
              }
              if (!bVar34) {
                (*sqlite3Config.mutex.xMutexLeave)(local_110);
              }
              sqlite3_free(pcVar11);
              sqlite3_free(p);
              return 0x13;
            }
            uVar13 = uVar13 - 1;
            ppBVar21 = ppBVar21 + -4;
          } while (1 < uVar13);
        }
        p->pBt = __s;
        __s->nRef = __s->nRef + 1;
        goto LAB_00120787;
      }
      __s = (BtShared *)0x0;
      goto LAB_00120787;
    }
    local_110 = (sqlite3_mutex *)0x0;
  }
LAB_0012009d:
  __s = (BtShared *)sqlite3Malloc(0x88);
  if (__s == (BtShared *)0x0) {
    iVar7 = 7;
  }
  else {
    memset(__s,0,0x88);
    local_98[0] = 0x1000;
    iVar26 = 0x58;
    if (0x58 < pVfs->szOsFile) {
      iVar26 = pVfs->szOsFile;
    }
    __s->pPager = (Pager *)0x0;
    uVar18 = local_ec & 2;
    local_e0 = zFilename;
    if (uVar18 == 0) {
      if (zFilename == (char *)0x0) {
        local_e0 = (char *)0x0;
        bVar33 = true;
LAB_001203da:
        local_c0 = '\0';
LAB_001203fe:
        local_100 = (Pager *)0x0;
        uVar19 = 0;
LAB_00120409:
        local_d8 = (char *)0x0;
        iVar7 = 0;
        goto LAB_00120414;
      }
      if (*zFilename == '\0') {
        bVar33 = false;
        goto LAB_001203da;
      }
      iVar7 = pVfs->mxPathname;
      local_100 = (Pager *)sqlite3Malloc((long)iVar7 * 2 + 2);
      if (local_100 == (Pager *)0x0) goto LAB_001203b5;
      *(char *)&local_100->pVfs = '\0';
      iVar7 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar7 + 1,(char *)local_100);
      sVar9 = strlen((char *)local_100);
      sVar10 = strlen(zFilename);
      uVar19 = (uint)sVar10 & 0x3fffffff;
      local_d8 = zFilename + (ulong)uVar19 + 1;
      pcVar11 = local_d8;
      if (*local_d8 == '\0') {
        iVar20 = uVar19 + (int)zFilename;
      }
      else {
        do {
          sVar10 = strlen(pcVar11);
          pcVar2 = pcVar11 + (sVar10 & 0x3fffffff);
          sVar10 = strlen(pcVar11 + (sVar10 & 0x3fffffff) + 1);
          pcVar11 = pcVar2 + (sVar10 & 0x3fffffff) + 2;
        } while (pcVar2[(sVar10 & 0x3fffffff) + 2] != '\0');
        iVar20 = (int)(sVar10 & 0x3fffffff) + (int)pcVar2 + 1;
      }
      if (iVar7 == 0) {
        uVar19 = (uint)sVar9 & 0x3fffffff;
        if ((int)(uVar19 + 8) <= pVfs->mxPathname) {
          iVar7 = (iVar20 - (int)local_d8) + 2;
          bVar33 = false;
          local_c0 = '\0';
          goto LAB_00120414;
        }
        iVar7 = 0xe;
        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xc907,
                    "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
      }
LAB_001209d7:
      sqlite3_free(local_100);
    }
    else if (zFilename == (char *)0x0) {
      local_c0 = '\x01';
      bVar33 = true;
      local_e0 = (char *)0x0;
      local_100 = (Pager *)0x0;
      local_d8 = (char *)0x0;
      iVar7 = 0;
      uVar19 = 0;
LAB_00120414:
      uVar13 = (ulong)uVar19;
      local_a0 = (size_t)iVar7;
      uVar31 = (ulong)(iVar26 + 7U & 0x7ffffff8);
      n = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) + uVar13 * 3 + uVar31 * 2 + local_a0 +
          0x189;
      pPVar12 = (Pager *)sqlite3Malloc(n);
      if (pPVar12 != (Pager *)0x0) {
        memset(pPVar12,0,n);
        pPVar12->pPCache = (PCache *)(pPVar12 + 1);
        pPVar12->fd = (sqlite3_file *)&pPVar12[1].fd;
        pcVar11 = pPVar12[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x40);
        pPVar12->sjfd = (sqlite3_file *)pcVar11;
        pPVar12->jfd = (sqlite3_file *)(pcVar11 + uVar31);
        pcVar11 = pcVar11 + uVar31 + uVar31;
        pPVar12->zFilename = pcVar11;
        if (local_100 != (Pager *)0x0) {
          pPVar12->zJournal = pcVar11 + (int)(uVar19 + iVar7 + 1);
          memcpy(pcVar11,local_100,uVar13);
          if (iVar7 != 0) {
            memcpy(pPVar12->zFilename + (uVar19 + 1),local_d8,local_a0);
          }
          memcpy(pPVar12->zJournal,local_100,uVar13);
          builtin_strncpy(pPVar12->zJournal + uVar13,"-journal",9);
          (pPVar12->zJournal + uVar13 + 8)[1] = '\0';
          pPVar12->zWal = pPVar12->zJournal + uVar13 + 9;
          memcpy(pPVar12->zJournal + uVar13 + 9,local_100,uVar13);
          builtin_strncpy(pPVar12->zWal + uVar13,"-wal",5);
          sqlite3_free(local_100);
        }
        pPVar12->pVfs = pVfs;
        pPVar12->vfsFlags = uVar8;
        if ((bVar33) || (*local_e0 == '\0')) {
LAB_00120900:
          pPVar12->eState = '\x01';
          pPVar12->eLock = '\x04';
          pPVar12->noLock = '\x01';
          bVar32 = (byte)uVar8 & 1;
          uVar27 = '\x01';
          bVar33 = false;
LAB_00120919:
          iVar7 = sqlite3PagerSetPagesize(pPVar12,local_98,-1);
          if (iVar7 == 0) {
            pcVar22 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            if (uVar18 == 0) {
              pcVar22 = pagerStress;
            }
            pPVar4 = pPVar12->pPCache;
            pPVar4->szSpill = 0;
            pPVar4->szPage = 0;
            pPVar4->szExtra = 0;
            pPVar4->bPurgeable = '\0';
            pPVar4->eCreate = '\0';
            *(undefined2 *)&pPVar4->field_0x2e = 0;
            pPVar4->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            pPVar4->pStress = (void *)0x0;
            pPVar4->pSynced = (PgHdr *)0x0;
            pPVar4->nRefSum = 0;
            pPVar4->szCache = 0;
            pPVar4->pDirty = (PgHdr *)0x0;
            pPVar4->pDirtyTail = (PgHdr *)0x0;
            pPVar4->pCache = (sqlite3_pcache *)0x0;
            pPVar4->szExtra = 0x88;
            pPVar4->bPurgeable = (byte)(uVar18 >> 1) ^ 1;
            pPVar4->eCreate = '\x02';
            pPVar4->xStress = pcVar22;
            pPVar4->pStress = pPVar12;
            pPVar4->szCache = 100;
            pPVar4->szSpill = 1;
            pPVar4->szPage = 1;
            iVar7 = sqlite3PcacheSetPageSize(pPVar4,local_98[0]);
            if (iVar7 == 0) {
              pPVar12->useJournal = (byte)(local_ec & 1) ^ 1;
              pPVar12->mxPgno = 0x3fffffff;
              pPVar12->tempFile = uVar27;
              pPVar12->exclusiveMode = uVar27;
              pPVar12->changeCountDone = uVar27;
              pPVar12->memDb = local_c0;
              pPVar12->readOnly = bVar32;
              pPVar12->noSync = uVar27;
              if (bVar33) {
                pPVar12->syncFlags = '\x02';
                pPVar12->fullSync = '\x01';
                pPVar12->extraSync = '\0';
                pPVar12->ckptSyncFlags = '\x02';
                pPVar12->walSyncFlags = '\"';
              }
              pPVar12->nExtra = 0x88;
              pPVar12->journalSizeLimit = -1;
              setSectorSize(pPVar12);
              if ((local_ec & 3) != 0) {
                pPVar12->journalMode = ((local_ec & 1) == 0) * '\x02' + '\x02';
              }
              pPVar12->xReiniter = pageReinit;
              if (pPVar12->errCode == 0) {
                if (pPVar12->bUseFetch == '\0') {
                  pcVar22 = getPageNormal;
                }
                else {
                  pcVar22 = getPageMMap;
                }
                pPVar12->xGet = pcVar22;
              }
              else {
                pPVar12->xGet = getPageError;
              }
              __s->pPager = pPVar12;
              pPVar12->szMmap = db->szMmap;
              pagerFixMaplimit(pPVar12);
              local_48 = 0;
              uStack_40 = 0;
              local_58 = 0;
              uStack_50 = 0;
              local_68 = 0;
              uStack_60 = 0;
              local_78 = 0;
              uStack_70 = 0;
              local_88 = 0;
              uStack_80 = 0;
              local_98[0] = 0;
              local_98[1] = 0;
              local_98[2] = 0;
              local_98[3] = 0;
              local_38 = 0;
              psVar5 = __s->pPager->fd;
              psVar6 = psVar5->pMethods;
              if (((psVar6 == (sqlite3_io_methods *)0x0) ||
                  (iVar7 = (*psVar6->xRead)(psVar5,local_98,100,0), iVar7 == 0x20a)) || (iVar7 == 0)
                 ) {
                __s->openFlags = (u8)local_ec;
                __s->db = db;
                pPVar12 = __s->pPager;
                pPVar12->xBusyHandler = btreeInvokeBusyHandler;
                pPVar12->pBusyHandlerArg = __s;
                psVar6 = pPVar12->fd->pMethods;
                if (psVar6 != (sqlite3_io_methods *)0x0) {
                  (*psVar6->xFileControl)(pPVar12->fd,0xf,&pPVar12->xBusyHandler);
                  pPVar12 = __s->pPager;
                }
                p->pBt = __s;
                __s->pCursor = (BtCursor *)0x0;
                __s->pPage1 = (MemPage *)0x0;
                if (pPVar12->readOnly != '\0') {
                  *(byte *)&__s->btsFlags = (byte)__s->btsFlags | 1;
                }
                iVar7 = (int)((local_88 & 0xff) << 8);
                uVar8 = (uint)local_88._1_1_ * 0x10000 + iVar7;
                __s->pageSize = uVar8;
                if (((iVar7 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
                   ((uVar8 + 0x1ffff & uVar8) != 0)) {
                  __s->pageSize = 0;
                  uVar8 = 0;
                  if (zFilename != (char *)0x0 && bVar17 == 0) {
                    __s->autoVacuum = '\0';
                    __s->incrVacuum = '\0';
                    uVar8 = 0;
                  }
                }
                else {
                  uVar8 = (uint)local_88._4_1_;
                  __s->btsFlags = __s->btsFlags | 2;
                  __s->autoVacuum = local_68._4_4_ != 0;
                  __s->incrVacuum = (int)local_58 != 0;
                }
                iVar7 = sqlite3PagerSetPagesize(pPVar12,&__s->pageSize,uVar8);
                if (iVar7 == 0) {
                  __s->usableSize = __s->pageSize - uVar8;
                  __s->nRef = 1;
                  if (p->sharable == '\0') goto LAB_001207b1;
                  if (sqlite3Config.bCoreMutex != 0) {
                    psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2);
                    if (sqlite3Config.bCoreMutex != 0) {
                      psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                      __s->mutex = psVar15;
                      if (psVar15 == (sqlite3_mutex *)0x0) {
                        iVar7 = 7;
                        goto LAB_001209dc;
                      }
                    }
                    if (psVar14 != (sqlite3_mutex *)0x0) {
                      (*sqlite3Config.mutex.xMutexEnter)(psVar14);
                      __s->pNext = sqlite3SharedCacheList;
                      sqlite3SharedCacheList = __s;
                      (*sqlite3Config.mutex.xMutexLeave)(psVar14);
                      goto LAB_001207b1;
                    }
                  }
                  __s->pNext = sqlite3SharedCacheList;
                  sqlite3SharedCacheList = __s;
                  goto LAB_001207b1;
                }
              }
              goto LAB_001209dc;
            }
          }
        }
        else {
          local_a4 = 0;
          iVar7 = (*pVfs->xOpen)(pVfs,pPVar12->zFilename,pPVar12->fd,uVar8 & 0x87f7f,
                                 (int *)&local_a4);
          if (iVar7 == 0) {
            uVar19 = local_a4 & 1;
            bVar32 = (byte)uVar19;
            uVar8 = (*pPVar12->fd->pMethods->xDeviceCharacteristics)(pPVar12->fd);
            if (uVar19 == 0) {
              setSectorSize(pPVar12);
              uVar19 = pPVar12->sectorSize;
              if (0x1000 < uVar19) {
                if (uVar19 < 0x2001) {
                  local_98[0] = uVar19;
                }
                else {
                  local_98[0] = 0x2000;
                }
              }
            }
            iVar7 = sqlite3_uri_boolean(local_e0,"nolock",0);
            pPVar12->noLock = (u8)iVar7;
            if (((uVar8 >> 0xd & 1) != 0) ||
               (iVar7 = sqlite3_uri_boolean(local_e0,"immutable",0), iVar7 != 0)) {
              uVar8 = 1;
              goto LAB_00120900;
            }
            bVar33 = true;
            uVar27 = '\0';
            goto LAB_00120919;
          }
        }
        psVar5 = pPVar12->fd;
        if (psVar5->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar5->pMethods->xClose)(psVar5);
          psVar5->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(pPVar12->pTmpSpace);
        local_100 = pPVar12;
        goto LAB_001209d7;
      }
      iVar7 = 7;
      if (local_100 != (Pager *)0x0) goto LAB_001209d7;
    }
    else {
      if (*zFilename == '\0') {
        local_c0 = '\x01';
        bVar33 = false;
        goto LAB_001203fe;
      }
      local_100 = (Pager *)sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
      if (local_100 != (Pager *)0x0) {
        sVar9 = strlen((char *)local_100);
        uVar19 = (uint)sVar9 & 0x3fffffff;
        bVar33 = true;
        local_e0 = (char *)0x0;
        local_c0 = '\x01';
        goto LAB_00120409;
      }
LAB_001203b5:
      iVar7 = 7;
    }
LAB_001209dc:
    if (__s->pPager != (Pager *)0x0) {
      sqlite3PagerClose(__s->pPager,(sqlite3 *)0x0);
    }
  }
  sqlite3_free(__s);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
  goto LAB_00120a09;
LAB_001206a5:
  ppBVar1 = &__s->pNext;
  __s = *ppBVar1;
  if (*ppBVar1 == (BtShared *)0x0) goto code_r0x001206ae;
  goto LAB_00120680;
code_r0x001206ae:
  __s = (BtShared *)0x0;
LAB_00120787:
  if (!bVar33) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar14);
  }
  sqlite3_free(pcVar11);
  if (__s == (BtShared *)0x0) goto LAB_0012009d;
LAB_001207b1:
  if ((p->sharable != '\0') && (0 < (long)db->nDb)) {
    lVar24 = 0;
    do {
      pBVar30 = *(Btree **)((long)&db->aDb->pBt + lVar24);
      if ((pBVar30 != (Btree *)0x0) && (pBVar30->sharable != '\0')) goto LAB_001207fb;
      lVar24 = lVar24 + 0x20;
    } while ((long)db->nDb * 0x20 != lVar24);
  }
  goto LAB_00120d29;
LAB_001207fb:
  do {
    pBVar25 = pBVar30;
    pBVar30 = pBVar25->pPrev;
  } while (pBVar25->pPrev != (Btree *)0x0);
  lVar24 = 0x20;
  if (p->pBt < pBVar25->pBt) {
    ppBVar21 = &pBVar25->pPrev;
    pBVar23 = (Btree *)0x0;
    pBVar30 = p;
  }
  else {
    do {
      pBVar29 = pBVar25;
      pBVar30 = pBVar29->pNext;
      if (pBVar30 == (Btree *)0x0) {
        ppBVar21 = &pBVar29->pNext;
        pBVar25 = (Btree *)0x0;
        pBVar23 = pBVar29;
        pBVar30 = p;
        goto LAB_00120d1e;
      }
      pBVar25 = pBVar30;
    } while (pBVar30->pBt < p->pBt);
    ppBVar21 = &pBVar29->pNext;
    p->pNext = pBVar30;
    lVar24 = 0x28;
    pBVar23 = p;
    pBVar25 = pBVar29;
  }
LAB_00120d1e:
  *(Btree **)((long)&p->db + lVar24) = pBVar25;
  pBVar30->pPrev = pBVar23;
  *ppBVar21 = p;
LAB_00120d29:
  *ppBtree = p;
  iVar7 = 0;
  pvVar16 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar16 == (void *)0x0) {
    pPVar4 = p->pBt->pPager->pPCache;
    pPVar4->szCache = -2000;
    (*sqlite3Config.pcache2.xCachesize)
              (pPVar4->pCache,(int)(0x1f4000 / (long)(pPVar4->szExtra + pPVar4->szPage)));
  }
  psVar5 = __s->pPager->fd;
  psVar6 = psVar5->pMethods;
  if (psVar6 != (sqlite3_io_methods *)0x0) {
    (*psVar6->xFileControl)(psVar5,0x1e,&__s->db);
  }
LAB_00120a09:
  if (local_110 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_110);
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#ifdef SQLITE_SECURE_DELETE
    pBt->btsFlags |= BTS_SECURE_DELETE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}